

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O3

void rol_2A(void)

{
  bool bVar1;
  
  except = '\0';
  bVar1 = carry_f != '\0';
  carry_f = acc & 0x80;
  acc = bVar1 | acc * '\x02';
  result_f = acc;
  return;
}

Assistant:

void rol_2A(void) {
    ubyte oldcar;
    CLE;
    oldcar = carry_f;

    carry_f = acc & 0x80;
    acc <<= 1;
    if (oldcar) acc++;
    result_f = acc;
}